

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

int google::protobuf::compiler::java::GetExperimentalJavaFieldType(FieldDescriptor *field)

{
  bool bVar1;
  char cVar2;
  Type TVar3;
  JavaType JVar4;
  int iVar5;
  Descriptor *type;
  string *psVar6;
  FieldDescriptor *field_00;
  uint uVar7;
  uint uVar8;
  string local_48 [39];
  allocator local_21;
  
  uVar7 = (uint)(*(int *)(field + 0x3c) == 2) * 0x100;
  TVar3 = FieldDescriptor::type(field);
  uVar8 = uVar7;
  if (TVar3 == TYPE_STRING) {
    if (*(int *)(*(long *)(field + 0x28) + 0x3c) == 3) {
      uVar8 = uVar7 | 0x200;
    }
    else {
      uVar8 = uVar7 + 0x200;
      if (*(char *)(*(long *)(*(long *)(field + 0x28) + 0x88) + 0x9a) == '\0') {
        uVar8 = uVar7;
      }
    }
  }
  if (*(int *)(field + 0x3c) != 2) {
    JVar4 = GetJavaType(field);
    if (JVar4 != JAVATYPE_MESSAGE) goto LAB_00230995;
    type = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
    bVar1 = HasRequiredFields(type);
    if (!bVar1) goto LAB_00230995;
  }
  uVar8 = uVar8 | 0x400;
LAB_00230995:
  bVar1 = HasHasbit(field);
  uVar7 = uVar8 + 0x1000;
  if (!bVar1) {
    uVar7 = uVar8;
  }
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    if (*(int *)(*(long *)(field + 0x28) + 0x3c) != 3) {
      psVar6 = (string *)google::protobuf::FieldDescriptor::message_type();
      std::__cxx11::string::string(local_48,"value",&local_21);
      field_00 = (FieldDescriptor *)google::protobuf::Descriptor::FindFieldByName(psVar6);
      std::__cxx11::string::~string(local_48);
      JVar4 = GetJavaType(field_00);
      if (JVar4 == JAVATYPE_ENUM) {
        uVar7 = uVar7 | 0x800;
      }
    }
    uVar7 = uVar7 | 0x32;
  }
  else {
    cVar2 = google::protobuf::FieldDescriptor::is_packed();
    if (cVar2 != '\0') {
      iVar5 = GetExperimentalJavaFieldTypeForPacked(field);
      return iVar5;
    }
    if (*(int *)(field + 0x3c) == 3) {
      uVar8 = GetExperimentalJavaFieldTypeForRepeated(field);
    }
    else {
      bVar1 = IsRealOneof(field);
      uVar8 = GetExperimentalJavaFieldTypeForSingular(field);
      if (bVar1) {
        uVar8 = uVar8 + 0x33;
      }
    }
    uVar7 = uVar7 | uVar8;
  }
  return uVar7;
}

Assistant:

int GetExperimentalJavaFieldType(const FieldDescriptor* field) {
  static const int kMapFieldType = 50;
  static const int kOneofFieldTypeOffset = 51;
  static const int kRequiredBit = 0x100;
  static const int kUtf8CheckBit = 0x200;
  static const int kCheckInitialized = 0x400;
  static const int kMapWithProto2EnumValue = 0x800;
  static const int kHasHasBit = 0x1000;
  int extra_bits = field->is_required() ? kRequiredBit : 0;
  if (field->type() == FieldDescriptor::TYPE_STRING && CheckUtf8(field)) {
    extra_bits |= kUtf8CheckBit;
  }
  if (field->is_required() || (GetJavaType(field) == JAVATYPE_MESSAGE &&
                               HasRequiredFields(field->message_type()))) {
    extra_bits |= kCheckInitialized;
  }
  if (HasHasbit(field)) {
    extra_bits |= kHasHasBit;
  }

  if (field->is_map()) {
    if (!SupportUnknownEnumValue(field)) {
      const FieldDescriptor* value =
          field->message_type()->FindFieldByName("value");
      if (GetJavaType(value) == JAVATYPE_ENUM) {
        extra_bits |= kMapWithProto2EnumValue;
      }
    }
    return kMapFieldType | extra_bits;
  } else if (field->is_packed()) {
    return GetExperimentalJavaFieldTypeForPacked(field);
  } else if (field->is_repeated()) {
    return GetExperimentalJavaFieldTypeForRepeated(field) | extra_bits;
  } else if (IsRealOneof(field)) {
    return (GetExperimentalJavaFieldTypeForSingular(field) +
            kOneofFieldTypeOffset) |
           extra_bits;
  } else {
    return GetExperimentalJavaFieldTypeForSingular(field) | extra_bits;
  }
}